

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::NotEquals,true,false,true,false>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  sel_t sVar8;
  long lVar9;
  int64_t *piVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  idx_t iVar17;
  long lVar18;
  interval_t *left;
  
  if (count + 0x3f < 0x40) {
    iVar17 = 0;
  }
  else {
    puVar2 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar17 = 0;
    uVar12 = 0;
    uVar11 = 0;
    do {
      if (puVar2 == (unsigned_long *)0x0) {
        uVar13 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar13 = count;
        }
LAB_01473592:
        uVar16 = uVar12;
        if (uVar12 < uVar13) {
          psVar3 = sel->sel_vector;
          iVar1 = ldata->days;
          lVar6 = ldata->micros;
          lVar5 = lVar6 / 86400000000 + (long)iVar1;
          iVar15 = ldata->months;
          psVar4 = true_sel->sel_vector;
          piVar10 = &rdata[uVar12].micros;
          do {
            uVar14 = uVar12;
            if (psVar3 != (sel_t *)0x0) {
              uVar14 = (ulong)psVar3[uVar12];
            }
            lVar9 = *piVar10;
            if (iVar1 == *(int32_t *)((long)piVar10 + -4) &&
                iVar15 == ((interval_t *)(piVar10 + -1))->months) {
              lVar18 = (long)iVar1;
              if (lVar6 != lVar9) goto LAB_01473687;
              uVar16 = 0;
            }
            else {
              lVar18 = (long)*(int32_t *)((long)piVar10 + -4);
LAB_01473687:
              lVar18 = lVar18 + lVar9 / 86400000000;
              uVar16 = 1;
              if ((lVar5 / 0x1e + (long)iVar15 ==
                   (long)((interval_t *)(piVar10 + -1))->months + lVar18 / 0x1e) &&
                 (lVar5 % 0x1e == lVar18 % 0x1e)) {
                uVar16 = (ulong)(lVar6 % 86400000000 != lVar9 % 86400000000);
              }
            }
            psVar4[iVar17] = (sel_t)uVar14;
            iVar17 = uVar16 + iVar17;
            uVar12 = uVar12 + 1;
            piVar10 = piVar10 + 2;
            uVar16 = uVar13;
          } while (uVar13 != uVar12);
        }
      }
      else {
        uVar14 = puVar2[uVar11];
        uVar13 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar13 = count;
        }
        uVar16 = uVar13;
        if (uVar14 != 0) {
          if (uVar14 == 0xffffffffffffffff) goto LAB_01473592;
          uVar16 = uVar12;
          if (uVar12 < uVar13) {
            psVar3 = sel->sel_vector;
            psVar4 = true_sel->sel_vector;
            piVar10 = &rdata[uVar12].micros;
            uVar7 = 0;
            do {
              if (psVar3 == (sel_t *)0x0) {
                sVar8 = (int)uVar12 + (int)uVar7;
              }
              else {
                sVar8 = psVar3[uVar12 + uVar7];
              }
              if ((uVar14 >> (uVar7 & 0x3f) & 1) == 0) {
                uVar16 = 0;
              }
              else {
                iVar1 = ldata->days;
                lVar5 = ldata->micros;
                lVar6 = *piVar10;
                iVar15 = *(int32_t *)((long)piVar10 + -4);
                if ((*(int32_t *)((long)piVar10 + -4) == iVar1 &&
                     ((interval_t *)(piVar10 + -1))->months == ldata->months) &&
                   (iVar15 = iVar1, lVar5 == lVar6)) {
                  uVar16 = 0;
                }
                else {
                  lVar18 = (long)iVar1 + lVar5 / 86400000000;
                  lVar9 = (long)iVar15 + lVar6 / 86400000000;
                  uVar16 = 1;
                  if (((long)ldata->months + lVar18 / 0x1e ==
                       (long)((interval_t *)(piVar10 + -1))->months + lVar9 / 0x1e) &&
                     (lVar18 % 0x1e == lVar9 % 0x1e)) {
                    uVar16 = (ulong)(lVar5 % 86400000000 != lVar6 % 86400000000);
                  }
                }
              }
              psVar4[iVar17] = sVar8;
              iVar17 = uVar16 + iVar17;
              uVar7 = uVar7 + 1;
              piVar10 = piVar10 + 2;
              uVar16 = uVar13;
            } while (uVar13 - uVar12 != uVar7);
          }
        }
      }
      uVar12 = uVar16;
      uVar11 = uVar11 + 1;
    } while (uVar11 != count + 0x3f >> 6);
  }
  return iVar17;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}